

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  FieldDescriptor *this;
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  int iVar3;
  Reflection *this_00;
  reference ppFVar4;
  Descriptor *pDVar5;
  FileDescriptor *file_00;
  Message *pMVar6;
  int local_98;
  int i;
  FileDescriptor *msg_extension_file;
  Descriptor *field_msg;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  Reflection *reflection;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  bool *has_opt_codesize_extension_local;
  Options *options_local;
  FileDescriptor *file_local;
  Message *msg_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)has_opt_codesize_extension;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&reflection);
  this_00 = Message::GetReflection(msg);
  Reflection::ListFields
            (this_00,msg,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&reflection);
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&reflection);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&reflection);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      msg_local._7_1_ = false;
LAB_001b8ca6:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&reflection);
      return msg_local._7_1_;
    }
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    this = *ppFVar4;
    pDVar5 = FieldDescriptor::message_type(this);
    if (pDVar5 != (Descriptor *)0x0) {
      bVar1 = FieldDescriptor::is_extension(this);
      if (bVar1) {
        pDVar5 = FieldDescriptor::message_type(this);
        file_00 = Descriptor::file(pDVar5);
        if (file_00 == file) {
          msg_local._7_1_ = true;
          goto LAB_001b8ca6;
        }
        if ((fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
           (FVar2 = GetOptimizeFor(file_00,options), FVar2 == FileOptions_OptimizeMode_CODE_SIZE)) {
          *(undefined1 *)
           fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
        }
      }
      bVar1 = FieldDescriptor::is_repeated(this);
      if (bVar1) {
        for (local_98 = 0; iVar3 = Reflection::FieldSize(this_00,msg,this), local_98 < iVar3;
            local_98 = local_98 + 1) {
          pMVar6 = Reflection::GetRepeatedMessage(this_00,msg,this,local_98);
          bVar1 = HasExtensionFromFile
                            (pMVar6,file,options,
                             (bool *)fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            msg_local._7_1_ = true;
            goto LAB_001b8ca6;
          }
        }
      }
      else {
        pMVar6 = Reflection::GetMessage(this_00,msg,this,(MessageFactory *)0x0);
        bVar1 = HasExtensionFromFile
                          (pMVar6,file,options,
                           (bool *)fields.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          msg_local._7_1_ = true;
          goto LAB_001b8ca6;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}